

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O2

uint right_encode(uchar *encbuf,size_t value)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  uchar *puVar4;
  size_t v;
  
  lVar2 = -8;
  sVar3 = value;
  for (lVar1 = 0; (puVar4 = encbuf, sVar3 != 0 && ((uint)lVar1 < 8)); lVar1 = lVar1 + 1) {
    sVar3 = sVar3 >> 8;
    lVar2 = lVar2 + 8;
  }
  for (; lVar2 != -8; lVar2 = lVar2 + -8) {
    *puVar4 = (uchar)(value >> ((byte)lVar2 & 0x3f));
    puVar4 = puVar4 + 1;
  }
  encbuf[lVar1] = (uchar)lVar1;
  return (uint)lVar1 + 1;
}

Assistant:

static unsigned int right_encode( unsigned char * encbuf, size_t value )
{
    unsigned int n, i;
    size_t v;

    for ( v = value, n = 0; v && (n < sizeof(size_t)); ++n, v >>= 8 )
        ; /* empty */
    for ( i = 1; i <= n; ++i )
        encbuf[i-1] = (unsigned char)(value >> (8 * (n-i)));
    encbuf[n] = (unsigned char)n;
    return n + 1;
}